

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O2

int proxy_client_init(proxy_client_handle *ch)

{
  int iVar1;
  int iVar2;
  conn_handle *conn;
  
  conn = (conn_handle *)ch->priv;
  if (conn == (conn_handle *)0x0) {
    conn = (conn_handle *)calloc(1,0x20);
    if (conn == (conn_handle *)0x0) {
      return -0xc;
    }
    ch->priv = conn;
  }
  conn->type = CONN_TYPE_TCP;
  iVar1 = conn_init(conn);
  iVar2 = 0;
  if (iVar1 < 0) {
    conn_free(conn);
    free(ch->priv);
    ch->priv = (void *)0x0;
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int proxy_client_init(struct proxy_client_handle *ch)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		ch->priv = priv;
	}

	priv->conn.type = CONN_TYPE_TCP;
	ret = conn_init(&priv->conn);
	if (ret < 0)
		goto proxy_client_init_exit;

	return 0;

proxy_client_init_exit:
	conn_free(&priv->conn);

	free(ch->priv);
	ch->priv = NULL;

	return ret;
}